

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cpp
# Opt level: O3

size_t __thiscall
RVO::RVOSimulator::addObstacle
          (RVOSimulator *this,vector<RVO::Vector2,_std::allocator<RVO::Vector2>_> *vertices)

{
  ulong uVar1;
  pointer *pppOVar2;
  pointer pVVar3;
  pointer pVVar4;
  Obstacle *pOVar5;
  iterator __position;
  Vector2 VVar6;
  size_t sVar7;
  long lVar8;
  Obstacle *this_00;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  long lVar13;
  ulong uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  Obstacle *obstacle;
  Obstacle *local_38;
  
  pVVar3 = (vertices->super__Vector_base<RVO::Vector2,_std::allocator<RVO::Vector2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4 = (vertices->super__Vector_base<RVO::Vector2,_std::allocator<RVO::Vector2>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  sVar7 = 0xffffffffffffffff;
  if (8 < (ulong)((long)pVVar4 - (long)pVVar3)) {
    lVar8 = (long)(this->obstacles_).
                  super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->obstacles_).
                  super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
    sVar7 = lVar8 >> 3;
    if (pVVar4 != pVVar3) {
      lVar13 = -8;
      uVar14 = 0;
      do {
        this_00 = (Obstacle *)operator_new(0x30);
        Obstacle::Obstacle(this_00);
        pVVar3 = (vertices->super__Vector_base<RVO::Vector2,_std::allocator<RVO::Vector2>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        this_00->point_ = pVVar3[uVar14];
        if (uVar14 != 0) {
          pOVar5 = (this->obstacles_).
                   super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1];
          this_00->prevObstacle_ = pOVar5;
          pOVar5->nextObstacle_ = this_00;
        }
        lVar11 = (long)(vertices->super__Vector_base<RVO::Vector2,_std::allocator<RVO::Vector2>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pVVar3;
        uVar9 = (lVar11 >> 3) - 1;
        if (uVar14 == uVar9) {
          pOVar5 = *(Obstacle **)
                    ((long)(this->obstacles_).
                           super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar8);
          this_00->nextObstacle_ = pOVar5;
          pOVar5->prevObstacle_ = this_00;
        }
        uVar1 = uVar14 + 1;
        uVar10 = 0;
        if (uVar14 != uVar9) {
          uVar10 = uVar1;
        }
        fVar15 = pVVar3[uVar10].x_ - pVVar3[uVar14].x_;
        fVar16 = pVVar3[uVar10].y_ - pVVar3[uVar14].y_;
        fVar17 = 1.0 / SQRT(fVar15 * fVar15 + fVar16 * fVar16);
        VVar6.y_ = fVar17 * fVar16;
        VVar6.x_ = fVar17 * fVar15;
        this_00->unitDir_ = VVar6;
        bVar12 = true;
        if (lVar11 != 0x10) {
          lVar11 = uVar9 * 8;
          if (uVar14 != 0) {
            lVar11 = lVar13;
          }
          fVar15 = *(float *)((long)&pVVar3->x_ + lVar11);
          fVar16 = *(float *)((long)&pVVar3->y_ + lVar11);
          bVar12 = 0.0 <= (pVVar3[uVar14].y_ - fVar16) * (fVar15 - pVVar3[uVar10].x_) -
                          (pVVar3[uVar14].x_ - fVar15) * (fVar16 - pVVar3[uVar10].y_);
        }
        this_00->isConvex_ = bVar12;
        __position._M_current =
             (this->obstacles_).
             super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        this_00->id_ = (long)__position._M_current -
                       (long)(this->obstacles_).
                             super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3;
        local_38 = this_00;
        if (__position._M_current ==
            (this->obstacles_).super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<RVO::Obstacle*,std::allocator<RVO::Obstacle*>>::
          _M_realloc_insert<RVO::Obstacle*const&>
                    ((vector<RVO::Obstacle*,std::allocator<RVO::Obstacle*>> *)&this->obstacles_,
                     __position,&local_38);
        }
        else {
          *__position._M_current = this_00;
          pppOVar2 = &(this->obstacles_).
                      super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppOVar2 = *pppOVar2 + 1;
        }
        lVar13 = lVar13 + 8;
        uVar14 = uVar1;
      } while (uVar1 < (ulong)((long)(vertices->
                                     super__Vector_base<RVO::Vector2,_std::allocator<RVO::Vector2>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(vertices->
                                     super__Vector_base<RVO::Vector2,_std::allocator<RVO::Vector2>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 3));
    }
  }
  return sVar7;
}

Assistant:

size_t RVOSimulator::addObstacle(const std::vector<Vector2> &vertices)
	{
		if (vertices.size() < 2) {
			return RVO_ERROR;
		}

		const size_t obstacleNo = obstacles_.size();

		for (size_t i = 0; i < vertices.size(); ++i) {
			Obstacle *obstacle = new Obstacle();
			obstacle->point_ = vertices[i];

			if (i != 0) {
				obstacle->prevObstacle_ = obstacles_.back();
				obstacle->prevObstacle_->nextObstacle_ = obstacle;
			}

			if (i == vertices.size() - 1) {
				obstacle->nextObstacle_ = obstacles_[obstacleNo];
				obstacle->nextObstacle_->prevObstacle_ = obstacle;
			}

			obstacle->unitDir_ = normalize(vertices[(i == vertices.size() - 1 ? 0 : i + 1)] - vertices[i]);

			if (vertices.size() == 2) {
				obstacle->isConvex_ = true;
			}
			else {
				obstacle->isConvex_ = (leftOf(vertices[(i == 0 ? vertices.size() - 1 : i - 1)], vertices[i], vertices[(i == vertices.size() - 1 ? 0 : i + 1)]) >= 0.0f);
			}

			obstacle->id_ = obstacles_.size();

			obstacles_.push_back(obstacle);
		}

		return obstacleNo;
	}